

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedRows(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int *perm)

{
  uint uVar1;
  uint uVar2;
  Status *pSVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (this->thedesc).rowstat.thesize;
  if (this->theLP->theRep == ROW) {
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = perm[uVar5];
      if (uVar5 != uVar2) {
        if ((int)uVar2 < 0) {
          if (0 < this->theLP->theRep * (this->thedesc).rowstat.data[uVar5]) {
            setStatus(this,NO_PROBLEM);
            this->matrixIsSetup = false;
            this->factorized = false;
          }
        }
        else {
          pSVar3 = (this->thedesc).rowstat.data;
          pSVar3[uVar2] = pSVar3[uVar5];
        }
      }
    }
  }
  else {
    uVar4 = 0;
    this->factorized = false;
    this->matrixIsSetup = false;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = perm[uVar4];
      if (uVar4 != uVar1) {
        if ((int)uVar1 < 0) {
          if (this->theLP->theRep * (this->thedesc).rowstat.data[uVar4] < 1) {
            setStatus(this,NO_PROBLEM);
          }
        }
        else {
          pSVar3 = (this->thedesc).rowstat.data;
          pSVar3[uVar1] = pSVar3[uVar4];
        }
      }
    }
  }
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedRows(const int perm[])
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   int i;
   int n = thedesc.nRows();

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // row got removed
            {
               if(theLP->isBasic(thedesc.rowStatus(i)))
               {
                  setStatus(NO_PROBLEM);
                  factorized = matrixIsSetup = false;
                  SPxOut::debug(this, "DCHBAS07 Warning: deleting basic row!\n");
               }
            }
            else                            // row was moved
               thedesc.rowStatus(perm[i]) = thedesc.rowStatus(i);
         }
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::COLUMN);

      factorized    = false;
      matrixIsSetup = false;

      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // row got removed
            {
               if(!theLP->isBasic(thedesc.rowStatus(i)))
                  setStatus(NO_PROBLEM);
            }
            else                            // row was moved
               thedesc.rowStatus(perm[i]) = thedesc.rowStatus(i);
         }
      }
   }

   reDim();
}